

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# A_socket.h
# Opt level: O1

void __thiscall adapter::ASocket::ASocket(ASocket *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  APlug *__tmp;
  
  this->_vptr_ASocket = (_func_int **)&PTR_charge_00129790;
  (this->paplug_).super___shared_ptr<adapter::APlug,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->paplug_).super___shared_ptr<adapter::APlug,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00129d40;
  (this->paplug_).super___shared_ptr<adapter::APlug,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  this_00 = (this->paplug_).super___shared_ptr<adapter::APlug,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->paplug_).super___shared_ptr<adapter::APlug,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

ASocket::ASocket(/* args */) {
    paplug_ = std::make_shared<APlug>();
}